

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_content_type.cpp
# Opt level: O3

content_type * __thiscall
cppcms::http::content_type::operator=(content_type *this,content_type *other)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this_00;
  element_type *peVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var2;
  
  peVar1 = (other->d).
           super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  p_Var2 = (other->d).
           super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
           _M_refcount._M_pi;
  (other->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = (element_type *)0x0;
  (other->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  this_00 = (this->d).
            super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
            _M_refcount._M_pi;
  (this->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>._M_ptr
       = peVar1;
  (this->d).super___shared_ptr<cppcms::http::content_type::data,_(__gnu_cxx::_Lock_policy)2>.
  _M_refcount._M_pi = p_Var2;
  if (this_00 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this_00);
  }
  return this;
}

Assistant:

content_type &content_type::operator=(content_type &&other)
	{
		d=std::move(other.d);
		return *this;
	}